

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::vSolveRight4update3sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double eps2,double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2,double eps3,
          double *vec3,int *idx3,double *rhs3,int *ridx3,int *rn3,double *forest,int *forestNum,
          int *forestIdx)

{
  double dVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  vSolveLright3(this,rhs,ridx,rn,eps,rhs2,ridx2,rn2,eps2,rhs3,ridx3,rn3,eps3);
  piVar2 = (this->row).perm;
  iVar3 = *rn;
  if (forest == (double *)0x0) {
    if (iVar3 < 1) {
      iVar6 = 0;
    }
    else {
      lVar8 = 0;
      uVar7 = 0;
      do {
        uVar9 = (uint)uVar7;
        iVar6 = ridx[lVar8];
        if (ABS(rhs[iVar6]) <= eps) {
          rhs[iVar6] = 0.0;
        }
        else {
          iVar3 = piVar2[iVar6];
          uVar5 = uVar9;
          if (0 < (int)uVar9) {
            do {
              uVar10 = (uint)uVar7 - 1;
              uVar4 = uVar10 >> 1;
              uVar5 = (uint)uVar7;
              if (iVar3 <= ridx[uVar4]) break;
              ridx[uVar7] = ridx[uVar4];
              uVar7 = (ulong)uVar4;
              uVar5 = uVar4;
            } while (1 < uVar10);
          }
          uVar7 = (ulong)(uVar9 + 1);
          ridx[(int)uVar5] = iVar3;
          iVar3 = *rn;
        }
        iVar6 = (int)uVar7;
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar3);
    }
    *rn = iVar6;
  }
  else {
    if (iVar3 < 1) {
      uVar9 = 0;
    }
    else {
      lVar8 = 0;
      uVar9 = 0;
      do {
        iVar6 = ridx[lVar8];
        dVar1 = rhs[iVar6];
        if (ABS(dVar1) <= eps) {
          rhs[iVar6] = 0.0;
        }
        else {
          *forestIdx = iVar6;
          iVar3 = piVar2[iVar6];
          uVar5 = uVar9;
          if (0 < (int)uVar9) {
            do {
              uVar4 = uVar5 - 1;
              uVar10 = uVar4 >> 1;
              if (iVar3 <= ridx[uVar10]) break;
              ridx[uVar5] = ridx[uVar10];
              uVar5 = uVar10;
            } while (1 < uVar4);
          }
          forestIdx = forestIdx + 1;
          uVar9 = uVar9 + 1;
          ridx[(int)uVar5] = iVar3;
          forest[iVar6] = dVar1;
          iVar3 = *rn;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar3);
    }
    *rn = uVar9;
    *forestNum = uVar9;
  }
  iVar3 = *rn2;
  uVar9 = 0;
  uVar5 = 0;
  if (0 < iVar3) {
    lVar8 = 0;
    uVar5 = 0;
    do {
      iVar6 = ridx2[lVar8];
      if (ABS(rhs2[iVar6]) <= eps2) {
        rhs2[iVar6] = 0.0;
      }
      else {
        iVar3 = piVar2[iVar6];
        uVar4 = uVar5;
        if (0 < (int)uVar5) {
          do {
            uVar11 = uVar4 - 1;
            uVar10 = uVar11 >> 1;
            if (iVar3 <= ridx2[uVar10]) break;
            ridx2[uVar4] = ridx2[uVar10];
            uVar4 = uVar10;
          } while (1 < uVar11);
        }
        uVar5 = uVar5 + 1;
        ridx2[(int)uVar4] = iVar3;
        iVar3 = *rn2;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
  }
  *rn2 = uVar5;
  iVar3 = *rn3;
  if (0 < iVar3) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      iVar6 = ridx3[lVar8];
      if (ABS(rhs3[iVar6]) <= eps3) {
        rhs3[iVar6] = 0.0;
      }
      else {
        iVar3 = piVar2[iVar6];
        uVar5 = uVar9;
        if (0 < (int)uVar9) {
          do {
            uVar10 = uVar5 - 1;
            uVar4 = uVar10 >> 1;
            if (iVar3 <= ridx3[uVar4]) break;
            ridx3[uVar5] = ridx3[uVar4];
            uVar5 = uVar4;
          } while (1 < uVar10);
        }
        uVar9 = uVar9 + 1;
        ridx3[(int)uVar5] = iVar3;
        iVar3 = *rn3;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
  }
  *rn3 = uVar9;
  iVar3 = vSolveUright(this,vec,idx,rhs,ridx,*rn,eps);
  *rn = iVar3;
  iVar3 = vSolveUright(this,vec2,idx2,rhs2,ridx2,*rn2,eps2);
  *rn2 = iVar3;
  iVar3 = vSolveUright(this,vec3,idx3,rhs3,ridx3,*rn3,eps3);
  *rn3 = iVar3;
  if ((this->l).updateType == 0) {
    iVar3 = vSolveUpdateRight(this,vec,idx,*rn,eps);
    *rn = iVar3;
    iVar3 = vSolveUpdateRight(this,vec2,idx2,*rn2,eps2);
    *rn2 = iVar3;
    iVar3 = vSolveUpdateRight(this,vec3,idx3,*rn3,eps3);
    *rn3 = iVar3;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}